

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *out,QBitArray *ba)

{
  char *pcVar1;
  long i;
  
  pcVar1 = (ba->d).d.ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  i = (ba->d).d.size * 8 - (long)*pcVar1;
  if (out->ver < 0x14) {
    if (0x7fffffff < i) {
      QDataStream::setStatus(out,SizeLimitExceeded);
      return out;
    }
    QDataStream::operator<<(out,(qint32)i);
  }
  else {
    QDataStream::operator<<(out,i);
  }
  if (0 < i) {
    pcVar1 = (ba->d).d.ptr;
    if (pcVar1 == (char *)0x0) {
      pcVar1 = "";
    }
    QDataStream::writeRawData(out,pcVar1 + 1,(ba->d).d.size + -1);
  }
  return out;
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QBitArray &ba)
{
    const qsizetype len = ba.size();
    if (out.version() < QDataStream::Qt_6_0) {
        if (Q_UNLIKELY(len > qsizetype{(std::numeric_limits<qint32>::max)()})) {
            out.setStatus(QDataStream::Status::SizeLimitExceeded);
            return out;
        }
        out << quint32(len);
    } else {
        out << quint64(len);
    }
    if (len > 0)
        out.writeRawData(ba.d.data() + 1, ba.d.size() - 1);
    return out;
}